

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O2

bool VulkanUtilities::anon_unknown_1::EnumerateInstanceExtensions
               (char *LayerName,
               vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions)

{
  pointer pVVar1;
  VkResult VVar2;
  bool bVar3;
  uint32_t ExtensionCount;
  string msg;
  uint32_t local_3c;
  string local_38;
  
  local_3c = 0;
  bVar3 = false;
  VVar2 = (*vkEnumerateInstanceExtensionProperties)
                    (LayerName,&local_3c,(VkExtensionProperties *)0x0);
  if (VVar2 == VK_SUCCESS) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
              (Extensions,(ulong)local_3c);
    VVar2 = (*vkEnumerateInstanceExtensionProperties)
                      (LayerName,&local_3c,
                       (Extensions->
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (VVar2 == VK_SUCCESS) {
      bVar3 = true;
      if (((long)(Extensions->
                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(Extensions->
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x104 != (ulong)local_3c) {
        Diligent::FormatString<char[165]>
                  (&local_38,
                   (char (*) [165])
                   "The number of extensions written by vkEnumerateInstanceExtensionProperties is not consistent with the count returned in the first call. This is a Vulkan loader bug."
                  );
        Diligent::DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"EnumerateInstanceExtensions",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                   ,0x8a);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
    else {
      pVVar1 = (Extensions->
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((Extensions->
          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>)._M_impl
          .super__Vector_impl_data._M_finish != pVVar1) {
        (Extensions->
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>)._M_impl.
        super__Vector_impl_data._M_finish = pVVar1;
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool EnumerateInstanceExtensions(const char* LayerName, std::vector<VkExtensionProperties>& Extensions)
{
    uint32_t ExtensionCount = 0;

    if (vkEnumerateInstanceExtensionProperties(LayerName, &ExtensionCount, nullptr) != VK_SUCCESS)
        return false;

    Extensions.resize(ExtensionCount);
    if (vkEnumerateInstanceExtensionProperties(LayerName, &ExtensionCount, Extensions.data()) != VK_SUCCESS)
    {
        Extensions.clear();
        return false;
    }
    VERIFY(ExtensionCount == Extensions.size(),
           "The number of extensions written by vkEnumerateInstanceExtensionProperties is not consistent "
           "with the count returned in the first call. This is a Vulkan loader bug.");

    return true;
}